

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O1

pointer __thiscall
slang::SmallVectorBase<slang::ast::RandSeqProductionSymbol::Rule>::
emplaceRealloc<slang::ast::RandSeqProductionSymbol::Rule>
          (SmallVectorBase<slang::ast::RandSeqProductionSymbol::Rule> *this,pointer pos,Rule *args)

{
  pointer pRVar1;
  ulong uVar2;
  size_type sVar3;
  pointer pRVar4;
  pointer pRVar5;
  pointer pRVar6;
  long lVar7;
  long lVar8;
  ulong uVar9;
  pointer pRVar10;
  undefined8 *puVar11;
  pointer pRVar12;
  pointer pRVar13;
  undefined8 *puVar14;
  long lVar15;
  byte bVar16;
  
  bVar16 = 0;
  if (this->len == 0x1c71c71c71c71c7) {
    detail::throwLengthError();
  }
  uVar9 = this->len + 1;
  uVar2 = this->cap;
  if (uVar9 < uVar2 * 2) {
    uVar9 = uVar2 * 2;
  }
  if (0x1c71c71c71c71c7 - uVar2 < uVar2) {
    uVar9 = 0x1c71c71c71c71c7;
  }
  lVar15 = (long)pos - (long)this->data_;
  pRVar6 = (pointer)operator_new(uVar9 * 0x48);
  pRVar1 = (pointer)((long)pRVar6 + lVar15);
  pRVar12 = pRVar1;
  for (lVar7 = 9; lVar7 != 0; lVar7 = lVar7 + -1) {
    (pRVar12->ruleBlock).ptr = (args->ruleBlock).ptr;
    args = (Rule *)((long)args + (ulong)bVar16 * -0x10 + 8);
    pRVar12 = (pointer)((long)pRVar12 + (ulong)bVar16 * -0x10 + 8);
  }
  pRVar12 = this->data_;
  sVar3 = this->len;
  lVar7 = (long)pRVar12 + (sVar3 * 0x48 - (long)pos);
  pRVar4 = pRVar12;
  pRVar5 = pRVar6;
  if (lVar7 == 0) {
    if (sVar3 != 0) {
      lVar7 = 0;
      do {
        puVar11 = (undefined8 *)((long)&(pRVar12->ruleBlock).ptr + lVar7);
        puVar14 = (undefined8 *)((long)&(pRVar6->ruleBlock).ptr + lVar7);
        for (lVar15 = 9; lVar15 != 0; lVar15 = lVar15 + -1) {
          *puVar14 = *puVar11;
          puVar11 = puVar11 + (ulong)bVar16 * -2 + 1;
          puVar14 = puVar14 + (ulong)bVar16 * -2 + 1;
        }
        lVar7 = lVar7 + 0x48;
      } while (sVar3 * 0x48 != lVar7);
    }
  }
  else {
    for (; pRVar4 != pos; pRVar4 = pRVar4 + 1) {
      pRVar10 = pRVar4;
      pRVar13 = pRVar5;
      for (lVar8 = 9; lVar8 != 0; lVar8 = lVar8 + -1) {
        (pRVar13->ruleBlock).ptr = (pRVar10->ruleBlock).ptr;
        pRVar10 = (pointer)((long)pRVar10 + (ulong)bVar16 * -0x10 + 8);
        pRVar13 = (pointer)((long)pRVar13 + ((ulong)bVar16 * -2 + 1) * 8);
      }
      pRVar5 = pRVar5 + 1;
    }
    memcpy((void *)((long)pRVar6 + lVar15 + 0x48),pos,((lVar7 - 0x48U) / 0x48) * 0x48 + 0x48);
  }
  if (pRVar12 != (pointer)this->firstElement) {
    operator_delete(pRVar12);
  }
  this->len = this->len + 1;
  this->cap = uVar9;
  this->data_ = pRVar6;
  return pRVar1;
}

Assistant:

typename SmallVectorBase<T>::pointer SmallVectorBase<T>::emplaceRealloc(const pointer pos,
                                                                        Args&&... args) {
    if (len == max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(len + 1);
    auto offset = static_cast<size_type>(pos - begin());
    auto newData = (pointer)::operator new(newCap * sizeof(T));

    // First construct the new element in the new memory,
    // so that we don't corrupt the new element if it relied on
    // existing elements we're about to move around.
    auto newPos = newData + offset;
    new (newPos) T(std::forward<Args>(args)...);

    // Now move elements to the new memory.
    if (pos == end()) {
        std::uninitialized_move(begin(), end(), newData);
    }
    else {
        std::uninitialized_move(begin(), pos, newData);
        std::uninitialized_move(pos, end(), newPos + 1);
    }

    cleanup();
    len++;
    cap = newCap;
    data_ = newData;
    return newPos;
}